

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_filter(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQOuter *pSVar2;
  SQSharedState *ss;
  SQTable *pSVar3;
  bool bVar4;
  SQObjectPtr *pSVar5;
  SQObjectValue SVar6;
  SQRESULT SVar7;
  SQObjectPtr *o;
  SQInteger SVar8;
  SQObjectPtr ret;
  SQObjectPtr val;
  SQObjectPtr local_68;
  SQObjectPtr local_58;
  SQObject local_48;
  SQOuter *local_38;
  
  pSVar5 = SQVM::GetAt(v,v->_stackbase);
  pSVar2 = (pSVar5->super_SQObject)._unVal.pOuter;
  ss = v->_sharedstate;
  SVar6.pUserPointer = sq_vm_malloc(0x48);
  SQArray::SQArray(SVar6.pArray,ss,0);
  local_58.super_SQObject._type = OT_ARRAY;
  pSVar1 = &((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  pSVar3 = (SQTable *)pSVar2->_idx;
  local_48._unVal.pTable = (SQTable *)0x0;
  local_48._type = OT_NULL;
  local_58.super_SQObject._unVal.pUserPointer = SVar6.pUserPointer;
  local_38 = pSVar2;
  if (0 < (long)pSVar3) {
    SVar6.pTable = (SQTable *)0x0;
    do {
      SQArray::Get((SQArray *)local_38,SVar6.nInteger,(SQObjectPtr *)&local_48);
      local_68.super_SQObject._type = (pSVar5->super_SQObject)._type;
      local_68.super_SQObject._unVal = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pTable;
      if ((local_68.super_SQObject._type >> 0x1b & 1) != 0) {
        pSVar1 = &((local_68.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SQVM::Push(v,&local_68);
      SQObjectPtr::~SQObjectPtr(&local_68);
      local_68.super_SQObject._type = OT_INTEGER;
      local_68.super_SQObject._unVal = SVar6;
      SQVM::Push(v,&local_68);
      SQObjectPtr::~SQObjectPtr(&local_68);
      SQVM::Push(v,(SQObjectPtr *)&local_48);
      SVar7 = sq_call(v,3,1,0);
      if (SVar7 < 0) {
        SVar8 = -1;
        goto LAB_0013118a;
      }
      o = SQVM::GetUp(v,-1);
      bVar4 = SQVM::IsFalse(o);
      if (!bVar4) {
        SQArray::Append(local_58.super_SQObject._unVal.pArray,&local_48);
      }
      SQVM::Pop(v);
      SVar6.pTable = (SQTable *)
                     ((long)&((SVar6.pTable)->super_SQDelegable).super_SQCollectable.
                             super_SQRefCounted._vptr_SQRefCounted + 1);
    } while (pSVar3 != SVar6.pTable);
  }
  SVar8 = 1;
  SQVM::Push(v,&local_58);
LAB_0013118a:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_48);
  SQObjectPtr::~SQObjectPtr(&local_58);
  return SVar8;
}

Assistant:

static SQInteger array_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQArray *a = _array(o);
    SQObjectPtr ret = SQArray::Create(_ss(v),0);
    SQInteger size = a->Size();
    SQObjectPtr val;
    for(SQInteger n = 0; n < size; n++) {
        a->Get(n,val);
        v->Push(o);
        v->Push(n);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _array(ret)->Append(val);
        }
        v->Pop();
    }
    v->Push(ret);
    return 1;
}